

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRHeadTrackingNode.cpp
# Opt level: O3

void __thiscall
MinVR::VRHeadTrackingNode::VRHeadTrackingNode
          (VRHeadTrackingNode *this,string *name,string *headTrackingEventName,
          VRMatrix4 *initialHeadMatrix)

{
  size_t *psVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *local_50;
  _List_node_base *local_48;
  _List_node_base local_40;
  
  VRDisplayNode::VRDisplayNode(&this->super_VRDisplayNode,name);
  (this->super_VRDisplayNode)._vptr_VRDisplayNode = (_func_int **)&PTR__VRHeadTrackingNode_00177710;
  (this->super_VREventHandler)._vptr_VREventHandler = (_func_int **)&DAT_00177780;
  VRMatrix4::VRMatrix4(&this->_headMatrix,initialHeadMatrix);
  (this->_trackingEvent)._M_dataplus._M_p = (pointer)&(this->_trackingEvent).field_2;
  pcVar2 = (headTrackingEventName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_trackingEvent,pcVar2,pcVar2 + headTrackingEventName->_M_string_length
            );
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HeadMatrix","");
  p_Var3 = (_List_node_base *)operator_new(0x30);
  p_Var3[1]._M_next = p_Var3 + 2;
  if (local_50 == &local_40) {
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
    p_Var3[2]._M_prev = local_40._M_prev;
  }
  else {
    p_Var3[1]._M_next = local_50;
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
  }
  p_Var3[1]._M_prev = local_48;
  local_48 = (_List_node_base *)0x0;
  local_40._M_next._0_1_ = 0;
  local_50 = &local_40;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_) + 1);
  }
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CameraMatrix","");
  p_Var3 = (_List_node_base *)operator_new(0x30);
  p_Var3[1]._M_next = p_Var3 + 2;
  if (local_50 == &local_40) {
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
    p_Var3[2]._M_prev = local_40._M_prev;
  }
  else {
    p_Var3[1]._M_next = local_50;
    p_Var3[2]._M_next = (_List_node_base *)CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_);
  }
  p_Var3[1]._M_prev = local_48;
  local_48 = (_List_node_base *)0x0;
  local_40._M_next._0_1_ = 0;
  local_50 = &local_40;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->super_VRDisplayNode)._valuesAdded.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(local_40._M_next._1_7_,local_40._M_next._0_1_) + 1);
  }
  return;
}

Assistant:

VRHeadTrackingNode::VRHeadTrackingNode(const std::string &name, const std::string &headTrackingEventName, VRMatrix4 initialHeadMatrix) :
    VRDisplayNode(name), _headMatrix(initialHeadMatrix), _trackingEvent(headTrackingEventName)
{
  _valuesAdded.push_back("HeadMatrix");
  _valuesAdded.push_back("CameraMatrix");
}